

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Info * __thiscall CMU462::Edge::getInfo_abi_cxx11_(Edge *this)

{
  bool bVar1;
  ostream *this_00;
  ostream *this_01;
  HalfedgeIter *pHVar2;
  Halfedge *pHVar3;
  ostream *this_02;
  Edge *in_RSI;
  char *pcVar4;
  Info *in_RDI;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  Info *info;
  value_type *in_stack_fffffffffffff8d8;
  value_type *__x;
  Edge *in_stack_fffffffffffff8e0;
  string *this_03;
  string local_6d0 [32];
  value_type local_6b0;
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  _List_node_base *local_610;
  ostringstream local_608 [376];
  ostringstream local_490 [376];
  ostringstream local_318 [392];
  ostringstream local_190 [383];
  byte local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x23330e);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::__cxx11::ostringstream::ostringstream(local_490);
  std::__cxx11::ostringstream::ostringstream(local_608);
  std::operator<<((ostream *)local_190,"EDGE");
  this_00 = std::operator<<((ostream *)local_318,"Address: ");
  std::ostream::operator<<(this_00,in_RSI);
  this_01 = std::operator<<((ostream *)local_490,"Halfedge: ");
  pHVar2 = halfedge(in_RSI);
  local_610 = pHVar2->_M_node;
  pHVar3 = elementAddress((HalfedgeIter)0x2333d5);
  std::ostream::operator<<(this_01,pHVar3);
  this_02 = std::operator<<((ostream *)local_608,"Boundary: ");
  bVar1 = isBoundary(in_stack_fffffffffffff8e0);
  pcVar4 = "NO";
  if (bVar1) {
    pcVar4 = "YES";
  }
  std::operator<<(this_02,pcVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00,(size_type)this_01);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_630);
  this_03 = local_650;
  std::__cxx11::string::string(this_03);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_03,in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_650);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_03,in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_670);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_03,in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_690);
  __x = &local_6b0;
  std::__cxx11::string::string((string *)__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_03,__x);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_03,__x);
  std::__cxx11::string::~string(local_6d0);
  local_11 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_608);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_02);
  }
  return in_RDI;
}

Assistant:

Info Edge::getInfo() {
  Info info;

  ostringstream m1, m2, m3, m4;
  m1 << "EDGE";
  m2 << "Address: " << this;
  m3 << "Halfedge: " << elementAddress(halfedge());
  m4 << "Boundary: " << (isBoundary() ? "YES" : "NO");

  info.reserve(4);
  info.push_back(m1.str());
  info.push_back(string());
  info.push_back(m2.str());
  info.push_back(m3.str());
  info.push_back(string());
  info.push_back(m4.str());

  return info;
}